

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_json(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,size_t id)

{
  size_t *psVar1;
  code *pcVar2;
  char cVar3;
  Location loc;
  Location LVar4;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  bool bVar5;
  error_flags eVar6;
  NodeScalar *pNVar7;
  size_t id_00;
  size_t sVar8;
  Tree *pTVar9;
  Tree *pTVar10;
  char msg [37];
  char local_78 [24];
  undefined5 uStack_60;
  undefined3 uStack_5b;
  undefined5 uStack_58;
  undefined3 uStack_53;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  pTVar9 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = -0x7a;
    local_78[9] = 'K';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    uStack_60 = 0x214288;
    uStack_5b = 0;
    uStack_58 = 0x65;
    uStack_53 = 0;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((~(int)pTVar9->m_buf[id].m_type.type & 0x28U) == 0) {
    builtin_strncpy(local_78 + 0x10,"_tree->i",8);
    uStack_60 = 0x7274735f73;
    builtin_strncpy(local_78,"check failed: !m",0x10);
    uStack_5b = 0x6d6165;
    uStack_58 = 0x29646928;
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_50 = 0;
    uStack_48 = 0x59d6;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x59d6) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x59d6) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_tree->m_callbacks).m_error)
              (local_78,0x25,LVar4,(this->m_tree->m_callbacks).m_user_data);
  }
  pTVar9 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = -0x7a;
    local_78[9] = 'K';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    uStack_60 = 0x214288;
    uStack_5b = 0;
    uStack_58 = 0x65;
    uStack_53 = 0;
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_00);
  }
  pTVar10 = this->m_tree;
  if ((~(int)pTVar9->m_buf[id].m_type.type & 3U) == 0) {
    pNVar7 = Tree::keysc(pTVar10,id);
    pTVar9 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = -0x7a;
      local_78[9] = 'K';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      uStack_60 = 0x214288;
      uStack_5b = 0;
      uStack_58 = 0x65;
      uStack_53 = 0;
      loc_01.super_LineCol.col = 0;
      loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_01.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_01.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
    }
    _write_json(this,pNVar7,(NodeType)(pTVar9->m_buf[id].m_type.type & ~VAL));
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x2151fd);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 2;
    pNVar7 = Tree::valsc(this->m_tree,id);
    pTVar9 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
LAB_001adde8:
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = -0x7a;
      local_78[9] = 'K';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      uStack_60 = 0x214288;
      uStack_5b = 0;
      uStack_58 = 0x65;
      uStack_53 = 0;
      loc_03.super_LineCol.col = 0;
      loc_03.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_03.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_03.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_03.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_03);
    }
  }
  else {
    if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = -0x7a;
      local_78[9] = 'K';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      uStack_60 = 0x214288;
      uStack_5b = 0;
      uStack_58 = 0x65;
      uStack_53 = 0;
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_02.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_02.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_02);
    }
    pTVar9 = this->m_tree;
    if ((pTVar10->m_buf[id].m_type.type & KEYVAL) != VAL) {
      if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        local_78[0] = '\0';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = -0x7a;
        local_78[9] = 'K';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        uStack_60 = 0x214288;
        uStack_5b = 0;
        uStack_58 = 0x65;
        uStack_53 = 0;
        loc_06.super_LineCol.col = 0;
        loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_06.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_06.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
      }
      if ((pTVar9->m_buf[id].m_type.type & (STREAM|MAP)) != NOTYPE) {
        pTVar9 = this->m_tree;
        if ((id == 0xffffffffffffffff) || (pTVar10 = pTVar9, pTVar9->m_cap <= id)) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = -0x7a;
          local_78[9] = 'K';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          local_78[0x13] = '\0';
          local_78[0x14] = '\0';
          local_78[0x15] = '\0';
          local_78[0x16] = '\0';
          local_78[0x17] = '\0';
          uStack_60 = 0x214288;
          uStack_5b = 0;
          uStack_58 = 0x65;
          uStack_53 = 0;
          loc_07.super_LineCol.col = 0;
          loc_07.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_07.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_07.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          loc_07.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_07);
          pTVar10 = this->m_tree;
        }
        if ((pTVar9->m_buf[id].m_type.type & KEY) != NOTYPE) {
          pNVar7 = Tree::keysc(pTVar10,id);
          pTVar9 = this->m_tree;
          if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            local_78[0] = '\0';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            local_78[8] = -0x7a;
            local_78[9] = 'K';
            local_78[10] = '\0';
            local_78[0xb] = '\0';
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            local_78[0xe] = '\0';
            local_78[0xf] = '\0';
            local_78[0x10] = '\0';
            local_78[0x11] = '\0';
            local_78[0x12] = '\0';
            local_78[0x13] = '\0';
            local_78[0x14] = '\0';
            local_78[0x15] = '\0';
            local_78[0x16] = '\0';
            local_78[0x17] = '\0';
            uStack_60 = 0x214288;
            uStack_5b = 0;
            uStack_58 = 0x65;
            uStack_53 = 0;
            loc_08.super_LineCol.col = 0;
            loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_08.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            loc_08.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
          }
          _write_json(this,pNVar7,(NodeType)(pTVar9->m_buf[id].m_type.type & ~VAL));
          std::ostream::write((char *)((this->
                                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).m_stream + 0x10),0x2151fd);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 2;
          pTVar10 = this->m_tree;
        }
        if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = -0x7a;
          local_78[9] = 'K';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          local_78[0x13] = '\0';
          local_78[0x14] = '\0';
          local_78[0x15] = '\0';
          local_78[0x16] = '\0';
          local_78[0x17] = '\0';
          uStack_60 = 0x214288;
          uStack_5b = 0;
          uStack_58 = 0x65;
          uStack_53 = 0;
          loc_09.super_LineCol.col = 0;
          loc_09.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_09.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_09.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          loc_09.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_09);
        }
        if ((pTVar10->m_buf[id].m_type.type & SEQ) == NOTYPE) {
          pTVar9 = this->m_tree;
          if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            local_78[0] = '\0';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            local_78[8] = -0x7a;
            local_78[9] = 'K';
            local_78[10] = '\0';
            local_78[0xb] = '\0';
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            local_78[0xe] = '\0';
            local_78[0xf] = '\0';
            local_78[0x10] = '\0';
            local_78[0x11] = '\0';
            local_78[0x12] = '\0';
            local_78[0x13] = '\0';
            local_78[0x14] = '\0';
            local_78[0x15] = '\0';
            local_78[0x16] = '\0';
            local_78[0x17] = '\0';
            uStack_60 = 0x214288;
            uStack_5b = 0;
            uStack_58 = 0x65;
            uStack_53 = 0;
            loc_10.super_LineCol.col = 0;
            loc_10.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
            loc_10.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
            loc_10.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            loc_10.name.len = 0x65;
            error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_10);
          }
          if ((pTVar9->m_buf[id].m_type.type & MAP) == NOTYPE) goto LAB_001ade53;
          cVar3 = (char)(this->
                        super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_stream;
        }
        else {
          cVar3 = (char)(this->
                        super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_stream;
        }
        std::ostream::put(cVar3 + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      goto LAB_001ade53;
    }
    pNVar7 = Tree::valsc(pTVar9,id);
    pTVar9 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      goto LAB_001adde8;
    }
  }
  _write_json(this,pNVar7,(NodeType)(pTVar9->m_buf[id].m_type.type & ~KEY));
LAB_001ade53:
  for (id_00 = Tree::first_child(this->m_tree,id); id_00 != 0xffffffffffffffff;
      id_00 = Tree::next_sibling(this->m_tree,id_00)) {
    sVar8 = Tree::first_child(this->m_tree,id);
    if (id_00 != sVar8) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    _do_visit_json(this,id_00);
  }
  pTVar9 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = -0x7a;
    local_78[9] = 'K';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    uStack_60 = 0x214288;
    uStack_5b = 0;
    uStack_58 = 0x65;
    uStack_53 = 0;
    loc_04.super_LineCol.col = 0;
    loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_04.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_04.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_04.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_04);
  }
  if ((pTVar9->m_buf[id].m_type.type & SEQ) == NOTYPE) {
    pTVar9 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar9->m_cap <= id)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = -0x7a;
      local_78[9] = 'K';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      uStack_60 = 0x214288;
      uStack_5b = 0;
      uStack_58 = 0x65;
      uStack_53 = 0;
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_05.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
    }
    if ((pTVar9->m_buf[id].m_type.type & MAP) == NOTYPE) {
      return;
    }
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream + '\x10');
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_json(size_t id)
{
    _RYML_CB_CHECK(m_tree->callbacks(), !m_tree->is_stream(id)); // JSON does not have streams
    if(m_tree->is_keyval(id))
    {
        _writek_json(id);
        this->Writer::_do_write(": ");
        _writev_json(id);
    }
    else if(m_tree->is_val(id))
    {
        _writev_json(id);
    }
    else if(m_tree->is_container(id))
    {
        if(m_tree->has_key(id))
        {
            _writek_json(id);
            this->Writer::_do_write(": ");
        }
        if(m_tree->is_seq(id))
            this->Writer::_do_write('[');
        else if(m_tree->is_map(id))
            this->Writer::_do_write('{');
    }  // container

    for(size_t ich = m_tree->first_child(id); ich != NONE; ich = m_tree->next_sibling(ich))
    {
        if(ich != m_tree->first_child(id))
            this->Writer::_do_write(',');
        _do_visit_json(ich);
    }

    if(m_tree->is_seq(id))
        this->Writer::_do_write(']');
    else if(m_tree->is_map(id))
        this->Writer::_do_write('}');
}